

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O0

difference_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
* __thiscall
burst::
make_difference_iterator<std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,void>
          (difference_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,vector<int,_std::allocator<int>_> *minuend,
          vector<int,_std::allocator<int>_> *subtrahend)

{
  const_iterator this_00;
  const_iterator minuend_begin;
  const_iterator minuend_end;
  const_iterator subtrahend_begin;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_R9;
  vector<int,_std::allocator<int>_> *subtrahend_local;
  vector<int,_std::allocator<int>_> *minuend_local;
  
  this_00 = std::begin<std::vector<int,std::allocator<int>>>
                      ((vector<int,_std::allocator<int>_> *)this);
  minuend_begin =
       std::end<std::vector<int,std::allocator<int>>>((vector<int,_std::allocator<int>_> *)this);
  minuend_end = std::begin<std::vector<int,std::allocator<int>>>(minuend);
  subtrahend_begin = std::end<std::vector<int,std::allocator<int>>>(minuend);
  make_difference_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            (__return_storage_ptr__,(burst *)this_00._M_current,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             minuend_begin._M_current,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             minuend_end._M_current,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             subtrahend_begin._M_current,in_R9);
  return __return_storage_ptr__;
}

Assistant:

auto make_difference_iterator (ForwardRange1 && minuend, ForwardRange2 && subtrahend)
    {
        using std::begin;
        using std::end;
        return
            make_difference_iterator
            (
                begin(std::forward<ForwardRange1>(minuend)),
                end(std::forward<ForwardRange1>(minuend)),
                begin(std::forward<ForwardRange2>(subtrahend)),
                end(std::forward<ForwardRange2>(subtrahend))
            );
    }